

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::localReportIter(HEkkPrimal *this,bool header)

{
  double dVar1;
  double dVar2;
  double dVar3;
  char cVar4;
  long lVar5;
  reference pvVar6;
  const_reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  uint uVar10;
  byte in_SIL;
  long *in_RDI;
  double measure;
  double infeasibility;
  double weight;
  double dual;
  HighsInt iRow;
  double value;
  double upper;
  double lower;
  HighsInt move;
  HighsInt flag;
  HighsInt iteration_count;
  HighsSimplexInfo *info;
  double local_60;
  int local_44;
  undefined4 local_40;
  
  if ((*(byte *)((long)in_RDI + 500) & 1) != 0) {
    lVar5 = *in_RDI;
    uVar10 = *(uint *)(*in_RDI + 0x36f8);
    if ((in_SIL & 1) == 0) {
      if ((int)in_RDI[199] + 10 < *(int *)(*in_RDI + 0x36f8)) {
        localReportIterHeader((HEkkPrimal *)0x7a6c45);
        *(uint *)(in_RDI + 199) = uVar10;
      }
      if (*(int *)((long)in_RDI + 0x4c) < 0) {
        printf("%5d %5d Bound flip   ",(ulong)uVar10,(ulong)*(uint *)((long)in_RDI + 0x44));
      }
      else {
        printf("%5d %5d  %5d  %5d",(ulong)uVar10,(ulong)*(uint *)((long)in_RDI + 0x44),
               (ulong)*(uint *)((long)in_RDI + 0x4c),(ulong)*(uint *)(in_RDI + 10));
      }
      if ((-1 < *(int *)((long)in_RDI + 0x64c)) && ((int)in_RDI[0xc9] <= (int)uVar10)) {
        pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)(*in_RDI + 0x2990),
                            (long)*(int *)((long)in_RDI + 0x64c));
        uVar10 = (uint)*pvVar6;
        pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)(*in_RDI + 0x29a8),
                            (long)*(int *)((long)in_RDI + 0x64c));
        cVar4 = *pvVar6;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar5 + 0x25a8),
                            (long)*(int *)((long)in_RDI + 0x64c));
        dVar1 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar5 + 0x25c0),
                            (long)*(int *)((long)in_RDI + 0x64c));
        dVar2 = *pvVar7;
        if (uVar10 == 1) {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(lVar5 + 0x25f0),
                              (long)*(int *)((long)in_RDI + 0x64c));
          local_40 = SUB84(*pvVar7,0);
        }
        else {
          local_44 = 0;
          while ((local_44 < *(int *)((long)in_RDI + 0x14) &&
                 (pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                     ((vector<int,_std::allocator<int>_> *)(*in_RDI + 0x2978),
                                      (long)local_44), *pvVar8 != *(int *)((long)in_RDI + 0x64c))))
          {
            local_44 = local_44 + 1;
          }
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(lVar5 + 0x2668),
                              (long)local_44);
          local_40 = SUB84(*pvVar7,0);
        }
        printf(": Var %2d (%1d, %2d) [%9.4g, %9.4g, %9.4g]",dVar1,local_40,dVar2,
               (ulong)*(uint *)((long)in_RDI + 0x64c),(ulong)uVar10,(ulong)(uint)(int)cVar4);
        if (uVar10 == 1) {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(lVar5 + 0x2578),
                              (long)*(int *)((long)in_RDI + 0x64c));
          dVar3 = *pvVar7;
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),
                              (long)*(int *)((long)in_RDI + 0x64c));
          local_60 = (double)-(int)cVar4 * dVar3;
          if ((((dVar1 == -INFINITY) && (!NAN(dVar1))) && (dVar2 == INFINITY)) && (!NAN(dVar2))) {
            local_60 = ABS(dVar3);
          }
          if (local_60 < (double)in_RDI[6]) {
            local_60 = 0.0;
          }
          printf(" Du = %9.4g; Wt = %9.4g; Ms = %9.4g",dVar3,SUB84(*pvVar9,0),
                 (local_60 * local_60) / *pvVar9);
        }
      }
      printf("\n");
    }
    else {
      localReportIterHeader((HEkkPrimal *)0x7a6c0c);
      *(uint *)(in_RDI + 199) = uVar10;
    }
  }
  return;
}

Assistant:

void HEkkPrimal::localReportIter(const bool header) {
  if (!report_hyper_chuzc) return;
  const HighsSimplexInfo& info = ekk_instance_.info_;
  HighsInt iteration_count = ekk_instance_.iteration_count_;
  if (header) {
    localReportIterHeader();
    last_header_iteration_count_ = iteration_count;
  } else {
    if (ekk_instance_.iteration_count_ > last_header_iteration_count_ + 10) {
      localReportIterHeader();
      last_header_iteration_count_ = iteration_count;
    }
    if (row_out >= 0) {
      printf("%5" HIGHSINT_FORMAT " %5" HIGHSINT_FORMAT "  %5" HIGHSINT_FORMAT
             "  %5" HIGHSINT_FORMAT "",
             iteration_count, variable_in, row_out, variable_out);
    } else {
      printf("%5" HIGHSINT_FORMAT " %5" HIGHSINT_FORMAT " Bound flip   ",
             iteration_count, variable_in);
    }
    if (check_column >= 0 && iteration_count >= check_iter) {
      HighsInt flag = ekk_instance_.basis_.nonbasicFlag_[check_column];
      HighsInt move = ekk_instance_.basis_.nonbasicMove_[check_column];
      double lower = info.workLower_[check_column];
      double upper = info.workUpper_[check_column];
      double value;
      if (flag == kNonbasicFlagTrue) {
        value = info.workValue_[check_column];
      } else {
        HighsInt iRow;
        for (iRow = 0; iRow < num_row; iRow++) {
          if (ekk_instance_.basis_.basicIndex_[iRow] == check_column) break;
        }
        assert(iRow < num_row);
        value = info.baseValue_[iRow];
      }
      printf(": Var %2" HIGHSINT_FORMAT " (%1" HIGHSINT_FORMAT
             ", %2" HIGHSINT_FORMAT ") [%9.4g, %9.4g, %9.4g]",
             check_column, flag, move, lower, value, upper);
      if (flag == kNonbasicFlagTrue) {
        double dual = info.workDual_[check_column];
        double weight = edge_weight_[check_column];
        double infeasibility = -move * dual;
        if (lower == -kHighsInf && upper == kHighsInf)
          infeasibility = fabs(dual);
        if (infeasibility < dual_feasibility_tolerance) infeasibility = 0;
        double measure = infeasibility * infeasibility / weight;
        printf(" Du = %9.4g; Wt = %9.4g; Ms = %9.4g", dual, weight, measure);
      }
    }
    printf("\n");
  }
}